

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

bool __thiscall
chaiscript::detail::Dispatch_Function::operator==(Dispatch_Function *this,Proxy_Function_Base *rhs)

{
  bool bVar1;
  
  if (rhs->_vptr_Proxy_Function_Base == (_func_int **)&PTR__Dispatch_Function_004a1ee8) {
    bVar1 = std::operator==(&this->m_funcs,
                            (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                             *)(rhs + 1));
    return bVar1;
  }
  __cxa_bad_cast();
}

Assistant:

bool operator==(const dispatch::Proxy_Function_Base &rhs) const noexcept override {
        try {
          const auto &dispatch_fun = dynamic_cast<const Dispatch_Function &>(rhs);
          return m_funcs == dispatch_fun.m_funcs;
        } catch (const std::bad_cast &) {
          return false;
        }
      }